

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMethod *stm)

{
  bool bVar1;
  element_type *peVar2;
  pointer pCVar3;
  mapped_type *pmVar4;
  pointer pCVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pIVar8;
  pointer pCVar9;
  type type;
  shared_ptr<MethodInfo> local_190;
  CError local_180;
  TypeInfo local_150;
  CError local_128;
  undefined1 local_f8 [8];
  string errorMessage_1;
  TypeInfo local_d8;
  int local_ac;
  CError local_a8;
  undefined1 local_78 [8];
  string errorMessage;
  undefined1 local_40 [7];
  bool isVisibleClass;
  TypeInfo expectedType;
  CMethod *stm_local;
  CTypeCheckerVisitor *this_local;
  
  expectedType._32_8_ = stm;
  std::operator<<((ostream *)&std::cout,"typechecker: method\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(expectedType._32_8_ + 0x28));
  if ((((bVar1) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(expectedType._32_8_ + 0x30)),
       bVar1)) &&
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(expectedType._32_8_ + 0x20)),
      bVar1)) &&
     (((bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(expectedType._32_8_ + 0x18)),
       bVar1 && (bVar1 = std::unique_ptr::operator_cast_to_bool
                                   ((unique_ptr *)(expectedType._32_8_ + 0x38)), bVar1)) &&
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(expectedType._32_8_ + 0x40)),
      bVar1)))) {
    peVar2 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->currentClass);
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                       ((unique_ptr<CIdExp,_std::default_delete<CIdExp>_> *)
                        (expectedType._32_8_ + 0x28));
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>_>
             ::operator[](&peVar2->methods,&pCVar3->name);
    std::shared_ptr<MethodInfo>::operator=(&this->currentMethod,pmVar4);
    std::operator<<((ostream *)&std::cout,"current method was got from symbol table\n");
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                       ((unique_ptr<CIdExp,_std::default_delete<CIdExp>_> *)
                        (expectedType._32_8_ + 0x28));
    (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
    pCVar5 = std::unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_>::operator->
                       ((unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_> *)
                        (expectedType._32_8_ + 0x30));
    (**(pCVar5->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar5,this);
    pCVar6 = std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::operator->
                       ((unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_> *)
                        (expectedType._32_8_ + 0x38));
    (**(pCVar6->super_IStatement).super_PositionedNode.super_INode._vptr_INode)(pCVar6,this);
    pCVar7 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator->
                       ((unique_ptr<CFieldList,_std::default_delete<CFieldList>_> *)
                        (expectedType._32_8_ + 0x40));
    (**(pCVar7->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar7,this);
    pIVar8 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                        (expectedType._32_8_ + 0x20));
    (**(pIVar8->super_PositionedNode).super_INode._vptr_INode)(pIVar8,this);
    pCVar9 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->
                       ((unique_ptr<CType,_std::default_delete<CType>_> *)
                        (expectedType._32_8_ + 0x18));
    if ((pCVar9->isPrimitive & 1U) == 0) {
      pCVar9 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->
                         ((unique_ptr<CType,_std::default_delete<CType>_> *)
                          (expectedType._32_8_ + 0x18));
      pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&pCVar9->name);
      TypeInfo::TypeInfo((TypeInfo *)local_40,&pCVar3->name);
    }
    else {
      pCVar9 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->
                         ((unique_ptr<CType,_std::default_delete<CType>_> *)
                          (expectedType._32_8_ + 0x18));
      TypeInfo::TypeInfo((TypeInfo *)local_40,pCVar9->type);
    }
    type = std::unique_ptr<CType,_std::default_delete<CType>_>::operator*
                     ((unique_ptr<CType,_std::default_delete<CType>_> *)(expectedType._32_8_ + 0x18)
                     );
    bVar1 = checkTypeExisting(this,type);
    if (bVar1) {
      TypeInfo::TypeInfo(&local_d8,ERROR_TYPE);
      bVar1 = ::operator==(&this->lastCalculatedType,&local_d8);
      TypeInfo::~TypeInfo(&local_d8);
      if (bVar1) {
        local_ac = 1;
      }
      else {
        bVar1 = ::operator!=(&this->lastCalculatedType,(TypeInfo *)local_40);
        if (bVar1) {
          CError::GetTypeErrorMessage_abi_cxx11_
                    ((CError *)local_f8,(TypeInfo *)local_40,&this->lastCalculatedType);
          pIVar8 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                             ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                              (expectedType._32_8_ + 0x20));
          CError::CError(&local_128,(string *)local_f8,&(pIVar8->super_PositionedNode).position);
          std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_128);
          CError::~CError(&local_128);
          local_ac = 1;
          std::__cxx11::string::~string((string *)local_f8);
        }
        else {
          TypeInfo::TypeInfo(&local_150,VOID);
          TypeInfo::operator=(&this->lastCalculatedType,&local_150);
          TypeInfo::~TypeInfo(&local_150);
          local_ac = 0;
        }
      }
    }
    else {
      pCVar9 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->
                         ((unique_ptr<CType,_std::default_delete<CType>_> *)
                          (expectedType._32_8_ + 0x18));
      pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&pCVar9->name);
      CError::GetUndeclaredErrorMessage((CError *)local_78,&pCVar3->name);
      pCVar9 = std::unique_ptr<CType,_std::default_delete<CType>_>::operator->
                         ((unique_ptr<CType,_std::default_delete<CType>_> *)
                          (expectedType._32_8_ + 0x18));
      CError::CError(&local_a8,(string *)local_78,
                     &(pCVar9->super_IWrapper).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_a8);
      CError::~CError(&local_a8);
      local_ac = 1;
      std::__cxx11::string::~string((string *)local_78);
    }
    TypeInfo::~TypeInfo((TypeInfo *)local_40);
    if (local_ac != 0) {
      return;
    }
  }
  else {
    CError::CError(&local_180,(string *)CError::AST_ERROR_abi_cxx11_,
                   (PositionInfo *)(expectedType._32_8_ + 8));
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_180);
    CError::~CError(&local_180);
  }
  std::shared_ptr<MethodInfo>::shared_ptr(&local_190,(nullptr_t)0x0);
  std::shared_ptr<MethodInfo>::operator=(&this->currentMethod,&local_190);
  std::shared_ptr<MethodInfo>::~shared_ptr(&local_190);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMethod &stm ) 
{
	std::cout << "typechecker: method\n";
    if( stm.name && stm.arguments && stm.returnExp && stm.returnType && stm.statements && stm.vars ) {
        currentMethod = currentClass->methods[stm.name->name];
        std::cout << "current method was got from symbol table\n";
        stm.name->Accept( *this );
        stm.arguments->Accept( *this );
        stm.statements->Accept( *this );
        stm.vars->Accept( *this );
        stm.returnExp->Accept( *this );
        TypeInfo expectedType = stm.returnType->isPrimitive ? TypeInfo(stm.returnType->type) : TypeInfo(stm.returnType->name->name);

        bool isVisibleClass = checkTypeExisting(*stm.returnType);
        if( !isVisibleClass ) {
            auto errorMessage = CError::GetUndeclaredErrorMessage( stm.returnType->name->name );
            errors.push_back( CError( errorMessage, stm.returnType->position) );
            return;
        }

        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != expectedType ) {
            auto errorMessage = CError::GetTypeErrorMessage( expectedType, lastCalculatedType );
			errors.push_back( CError( errorMessage, stm.returnExp->position ) );
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentMethod = nullptr;
}